

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O3

void __thiscall
RootIndexProxyModelPrivate::onColumnsAboutToBeInserted
          (RootIndexProxyModelPrivate *this,QModelIndex *parent,int first,int last)

{
  QModelIndex *pQVar1;
  QModelIndex childIdx;
  QModelIndex childIdx_00;
  char cVar2;
  bool bVar3;
  RootIndexProxyModelPrivate *pRVar4;
  QPersistentModelIndex *this_00;
  QModelIndex local_90;
  undefined8 local_78;
  quintptr qStack_70;
  QAbstractItemModel *local_68;
  QPersistentModelIndex local_48;
  RootIndexProxyModel *pRStack_40;
  QAbstractItemModel *local_38;
  
  pQVar1 = (QModelIndex *)this->q_ptr;
  this_00 = &this->m_rootIndex;
  cVar2 = QPersistentModelIndex::isValid();
  if (cVar2 != '\0') {
    pRVar4 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffb8;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_00);
    childIdx.i = (quintptr)pRStack_40;
    childIdx._0_8_ = local_48.d;
    childIdx.m = local_38;
    bVar3 = isDescendant(pRVar4,childIdx,parent);
    if (bVar3) {
      return;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_00);
    if ((((local_90.r != parent->r) || (local_90.i != parent->i)) || (local_90.c != parent->c)) ||
       (local_90.m != parent->m)) {
      local_68 = parent->m;
      local_78._0_4_ = parent->r;
      local_78._4_4_ = parent->c;
      qStack_70 = parent->i;
      pRVar4 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffa0;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&stack0xffffffffffffffa0,this_00);
      childIdx_00.i = qStack_70;
      childIdx_00.r = (undefined4)local_78;
      childIdx_00.c = local_78._4_4_;
      childIdx_00.m = local_68;
      bVar3 = isDescendant(pRVar4,childIdx_00,(QModelIndex *)&stack0xffffffffffffffa0);
      if (!bVar3) {
        return;
      }
    }
  }
  (**(code **)(*(long *)pQVar1 + 0x198))(&local_90,pQVar1,parent);
  QAbstractItemModel::beginInsertColumns(pQVar1,(int)&local_90,first);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsAboutToBeInserted(const QModelIndex &parent, int first, int last)
{
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!parent.isValid() || parent.model() == q->sourceModel());
    if (m_rootIndex.isValid()) {
        if (isDescendant(m_rootIndex, parent))
            return;
        if (parent != m_rootIndex && !isDescendant(parent, m_rootIndex))
            return;
    }
    q->beginInsertColumns(q->mapFromSource(parent), first, last);
}